

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool test(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  bool bVar5;
  uint local_24;
  uint local_20;
  uint L_5;
  uint L_4;
  uint L_3;
  uint L_2;
  uint L_1;
  uint L;
  bool ok;
  
  bVar5 = true;
  poVar4 = std::operator<<((ostream *)&std::cout,"Karp-Rabin");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (L_2 = 1; L_2 < 0x21; L_2 = L_2 + 1) {
    if (bVar5 == false) {
      return false;
    }
    bVar1 = isItAFunction<KarpRabinHash<unsigned_int,unsigned_char>>(7);
    bVar5 = (bVar5 & bVar1) != 0;
  }
  bVar1 = isItRandom<KarpRabinHash<unsigned_int,unsigned_char>>(0x13);
  bVar5 = (bool)(bVar5 & bVar1);
  for (L_3 = 1; bVar5 = bVar5 != false, L_3 < 0x41; L_3 = L_3 + 1) {
    if (!bVar5) {
      return false;
    }
    bVar1 = isItAFunction<KarpRabinHash<unsigned_long_long,unsigned_char>>(7);
    bVar5 = bVar5 && bVar1;
  }
  bVar1 = isItRandom<KarpRabinHash<unsigned_long_long,unsigned_char>>(0x13);
  bVar5 = bVar5 && bVar1;
  if (bVar5) {
    poVar4 = std::operator<<((ostream *)&std::cout,"cyclic");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    for (L_4 = 2; L_4 < 0x21; L_4 = L_4 + 1) {
      if (bVar5 == false) {
        return false;
      }
      bVar1 = testExtendAndPrepend<CyclicHash<unsigned_int,unsigned_char>>(L_4);
      bVar2 = isItAFunction<CyclicHash<unsigned_int,unsigned_char>>(L_4);
      bVar3 = doesReverseUpdateWorks<CyclicHash<unsigned_int,unsigned_char>>(L_4);
      bVar5 = ((bVar5 & bVar1) != 0 && bVar2) && bVar3;
    }
    for (L_5 = 2; L_5 < 0x41; L_5 = L_5 + 1) {
      if (bVar5 == false) {
        return false;
      }
      bVar1 = testExtendAndPrepend<CyclicHash<unsigned_long_long,unsigned_char>>(L_5);
      bVar2 = isItAFunction<CyclicHash<unsigned_long_long,unsigned_char>>(L_5);
      bVar5 = (bVar5 & bVar1) != 0 && bVar2;
    }
    bVar1 = isItRandom<CyclicHash<unsigned_int,unsigned_char>>(0x13);
    bVar2 = isItRandom<CyclicHash<unsigned_long_long,unsigned_char>>(0x13);
    L_1._2_1_ = (bVar5 & bVar1) != 0 && bVar2;
    poVar4 = std::operator<<((ostream *)&std::cout,"three-wise");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    for (local_20 = 1; local_20 < 0x21; local_20 = local_20 + 1) {
      bVar5 = isItAFunction<ThreeWiseHash<unsigned_int,unsigned_char>>(local_20);
      L_1._2_1_ = (L_1._2_1_ & bVar5) != 0;
    }
    bVar5 = isItRandom<ThreeWiseHash<unsigned_int,unsigned_char>>(0x13);
    bVar5 = (bool)(L_1._2_1_ & bVar5);
    for (local_24 = 1; L_1._2_1_ = bVar5 != false, local_24 < 0x41; local_24 = local_24 + 1) {
      bVar5 = isItAFunction<ThreeWiseHash<unsigned_long_long,unsigned_char>>(local_24);
      bVar5 = L_1._2_1_ && bVar5;
    }
    bVar1 = isItRandom<ThreeWiseHash<unsigned_long_long,unsigned_char>>(0x13);
    poVar4 = std::operator<<((ostream *)&std::cout,"general");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar5 = isItAFunction<GeneralHash<0,unsigned_int,unsigned_char>>(9);
    bVar5 = (L_1._2_1_ && bVar1) && bVar5;
    if (bVar5) {
      bVar1 = isItRandom<GeneralHash<0,unsigned_int,unsigned_char>>(0x13);
      bVar5 = bVar5 && bVar1;
      if (bVar5) {
        bVar2 = isItAFunction<GeneralHash<0,unsigned_int,unsigned_char>>(0x13);
        poVar4 = std::operator<<((ostream *)&std::cout,"general");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        bVar1 = isItAFunction<GeneralHash<1,unsigned_int,unsigned_char>>(9);
        bVar1 = (bVar5 && bVar2) && bVar1;
        if (bVar1) {
          bVar5 = isItRandom<GeneralHash<1,unsigned_int,unsigned_char>>(0x13);
          bVar1 = bVar1 && bVar5;
          if (bVar1) {
            bVar5 = isItAFunction<GeneralHash<1,unsigned_int,unsigned_char>>(0x13);
            L_1._3_1_ = bVar1 && bVar5;
          }
          else {
            L_1._3_1_ = false;
          }
        }
        else {
          L_1._3_1_ = false;
        }
      }
      else {
        L_1._3_1_ = false;
      }
    }
    else {
      L_1._3_1_ = false;
    }
  }
  else {
    L_1._3_1_ = false;
  }
  return L_1._3_1_;
}

Assistant:

bool test() {
  bool ok(true);
  cout << "Karp-Rabin" << endl;
  for (uint L = 1; L <= 32; ++L) {
    if (!ok)
      return false;
    ok &= isItAFunction<KarpRabinHash<>>();
  }
  ok &= isItRandom<KarpRabinHash<>>();
  for (uint L = 1; L <= 64; ++L) {
    if (!ok)
      return false;
    ok &= isItAFunction<KarpRabinHash<uint64>>();
  }
  ok &= isItRandom<KarpRabinHash<uint64>>();
  if (!ok)
    return false;
  cout << "cyclic" << endl;
  for (uint L = 2; L <= 32; ++L) {
    if (!ok)
      return false;
    ok &= testExtendAndPrepend<CyclicHash<>>(L);
    ok &= isItAFunction<CyclicHash<>>(L);
    ok &= doesReverseUpdateWorks<CyclicHash<>>(L);
  }
  for (uint L = 2; L <= 64; ++L) {
    if (!ok)
      return false;
    ok &= testExtendAndPrepend<CyclicHash<uint64>>(L);
    ok &= isItAFunction<CyclicHash<uint64>>(L);
  }
  ok &= isItRandom<CyclicHash<>>();
  ok &= isItRandom<CyclicHash<uint64>>();

  cout << "three-wise" << endl;
  for (uint L = 1; L <= 32; ++L) {
    ok &= isItAFunction<ThreeWiseHash<>>(L);
  }
  ok &= isItRandom<ThreeWiseHash<>>();
  for (uint L = 1; L <= 64; ++L) {
    ok &= isItAFunction<ThreeWiseHash<uint64>>(L);
  }
  ok &= isItRandom<ThreeWiseHash<uint64>>();

  cout << "general" << endl;
  ok &= isItAFunction<GeneralHash<NOPRECOMP>>(9);
  if (!ok)
    return false;
  ok &= isItRandom<GeneralHash<NOPRECOMP>>();
  if (!ok)
    return false;
  ok &= isItAFunction<GeneralHash<NOPRECOMP>>(19);
  cout << "general" << endl;
  ok &= isItAFunction<GeneralHash<FULLPRECOMP>>(9);
  if (!ok)
    return false;
  ok &= isItRandom<GeneralHash<FULLPRECOMP>>();
  if (!ok)
    return false;
  ok &= isItAFunction<GeneralHash<FULLPRECOMP>>(19);
  return ok;
}